

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O3

void __thiscall
SyncFixture_SyncToBadVersions_Test::~SyncFixture_SyncToBadVersions_Test
          (SyncFixture_SyncToBadVersions_Test *this)

{
  (this->super_SyncFixture).super_Test._vptr_Test = (_func_int **)&PTR__SyncFixture_00270fa0;
  pstore::database::~database(&(this->super_SyncFixture).db_);
  in_memory_store::~in_memory_store(&(this->super_SyncFixture).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x158);
  return;
}

Assistant:

TEST_F (SyncFixture, SyncToBadVersions) {
    check_for_error ([this] () { db_.sync (1); }, pstore::error_code::unknown_revision);

    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->add (t1, "a", "first value");
        t1.commit ();
    }
    db_.sync (1);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        this->add (t2, "b", "second value");
        t2.commit ();
    }

    check_for_error ([this] () { db_.sync (3); }, pstore::error_code::unknown_revision);
}